

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

string * __thiscall
duckdb::StandardBufferManager::GetTemporaryPath_abi_cxx11_
          (string *__return_storage_ptr__,StandardBufferManager *this,block_id_t id)

{
  FileSystem *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  this_00 = FileSystem::GetFileSystem(this->db);
  ::std::__cxx11::to_string(&local_48,id);
  ::std::operator+(&bStack_88,"duckdb_temp_block-",&local_48);
  ::std::operator+(&local_68,&bStack_88,".block");
  FileSystem::JoinPath
            ((string *)__return_storage_ptr__,this_00,(string *)&this->temporary_directory,
             (string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&bStack_88);
  ::std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

string StandardBufferManager::GetTemporaryPath(block_id_t id) {
	auto &fs = FileSystem::GetFileSystem(db);
	return fs.JoinPath(temporary_directory.path, "duckdb_temp_block-" + to_string(id) + ".block");
}